

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

Roaring * roaring::Roaring::fastunion(Roaring *__return_storage_ptr__,size_t n,Roaring **inputs)

{
  size_t k;
  roaring_bitmap_t **x;
  size_t sVar1;
  roaring_bitmap_t *s;
  runtime_error *this;
  
  x = (roaring_bitmap_t **)roaring_malloc(n * 8);
  if (x == (roaring_bitmap_t **)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"failed memory alloc in fastunion");
  }
  else {
    for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
      x[sVar1] = (roaring_bitmap_t *)inputs[sVar1];
    }
    s = (roaring_bitmap_t *)roaring_bitmap_or_many(n,x);
    if (s != (roaring_bitmap_t *)0x0) {
      Roaring(__return_storage_ptr__,s);
      roaring_free(x);
      return __return_storage_ptr__;
    }
    roaring_free(x);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"failed memory alloc in fastunion");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        const roaring_bitmap_t **x = (const roaring_bitmap_t **)roaring_malloc(
            n * sizeof(roaring_bitmap_t *));
        if (x == NULL) {
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        for (size_t k = 0; k < n; ++k) x[k] = &inputs[k]->roaring;

        roaring_bitmap_t *c_ans = api::roaring_bitmap_or_many(n, x);
        if (c_ans == NULL) {
            roaring_free(x);
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        Roaring ans(c_ans);
        roaring_free(x);
        return ans;
    }